

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

int __thiscall rcg::System::close(System *this,int __fd)

{
  recursive_mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined8 uVar3;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if ((0 < this->n_open) && (iVar2 = this->n_open + -1, this->n_open = iVar2, iVar2 == 0)) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->TLClose)(this->tl);
      this->tl = (void *)0x0;
      p_Var1 = (this->nodemap).
               super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      p_Var1 = (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar2;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void System::close()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      gentl->TLClose(tl);
      tl=0;

      nodemap=0;
      cport=0;
    }
  }
}